

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t exr_start_read(exr_context_t *ctxt,char *filename,exr_context_initializer_t *ctxtdata)

{
  exr_result_t eVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  exr_context_initializer_t inits;
  exr_context_t ret;
  exr_result_t rv;
  exr_context_t in_stack_00000098;
  exr_context_initializer_t *in_stack_ffffffffffffff68;
  exr_context_t in_stack_ffffffffffffff70;
  exr_context_t *in_stack_ffffffffffffff78;
  exr_attr_string_t *in_stack_ffffffffffffff80;
  exr_context_t in_stack_ffffffffffffff88;
  long local_70;
  size_t in_stack_ffffffffffffffa0;
  _INTERNAL_EXR_CONTEXT_MODE in_stack_ffffffffffffffac;
  exr_context_initializer_t *in_stack_ffffffffffffffb0;
  exr_context_t *in_stack_ffffffffffffffb8;
  uint local_38;
  exr_result_t local_24;
  exr_result_t local_4;
  
  fill_context_data((exr_context_initializer_t *)in_stack_ffffffffffffff70);
  if (in_RDI == (undefined8 *)0x0) {
    if ((local_38 & 2) == 0) {
      (*(code *)in_stack_ffffffffffffff70)
                (0,3,"Invalid context handle passed to start_read function");
    }
    local_4 = 3;
  }
  else {
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      if ((local_38 & 2) == 0) {
        (*(code *)in_stack_ffffffffffffff70)(0,3,"Invalid filename passed to start_read function");
      }
      local_24 = 3;
    }
    else {
      eVar1 = internal_exr_alloc_context
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
      if (eVar1 == 0) {
        pcRam0000000000000028 = dispatch_read;
        local_24 = exr_attr_string_create
                             (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (char *)in_stack_ffffffffffffff78);
        if (local_24 == 0) {
          if (local_70 == 0) {
            local_24 = default_init_read_file(in_stack_ffffffffffffff88);
          }
          if (local_24 == 0) {
            local_24 = process_query_size(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          }
          if (local_24 == 0) {
            local_24 = internal_exr_parse_header(in_stack_00000098);
          }
        }
        if (local_24 != 0) {
          exr_finish(in_stack_ffffffffffffff78);
        }
      }
      else {
        local_24 = 1;
      }
    }
    *in_RDI = 0;
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_start_read (
    exr_context_t*                   ctxt,
    const char*                      filename,
    const exr_context_initializer_t* ctxtdata)
{
    exr_result_t              rv    = EXR_ERR_UNKNOWN;
    exr_context_t             ret   = NULL;
    exr_context_initializer_t inits = fill_context_data (ctxtdata);

    if (!ctxt)
    {
        if (!(inits.flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE))
            inits.error_handler_fn (
                NULL,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid context handle passed to start_read function");
        return EXR_ERR_INVALID_ARGUMENT;
    }

    if (filename && filename[0] != '\0')
    {
        rv = internal_exr_alloc_context (
            &ret,
            &inits,
            EXR_CONTEXT_READ,
            sizeof (struct _internal_exr_filehandle));
        if (rv == EXR_ERR_SUCCESS)
        {
            ret->do_read = &dispatch_read;

            rv = exr_attr_string_create (
                (exr_context_t) ret, &(ret->filename), filename);
            if (rv == EXR_ERR_SUCCESS)
            {
                if (!inits.read_fn)
                {
                    inits.size_fn = &default_query_size_func;
                    rv            = default_init_read_file (ret);
                }

                if (rv == EXR_ERR_SUCCESS)
                    rv = process_query_size (ret, &inits);
                if (rv == EXR_ERR_SUCCESS) rv = internal_exr_parse_header (ret);
            }

            if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
        }
        else
            rv = EXR_ERR_OUT_OF_MEMORY;
    }
    else
    {
        if (!(inits.flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE))
            inits.error_handler_fn (
                NULL,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid filename passed to start_read function");
        rv = EXR_ERR_INVALID_ARGUMENT;
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}